

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple pybind11::make_tuple<(pybind11::return_value_policy)1,int_const&,int_const&,int_const&>
                (int *args_,int *args__1,int *args__2)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  handle *this;
  undefined8 uVar4;
  PyObject **ppPVar5;
  object in_RDI;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_3UL> *__range2;
  int counter;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  argtypes;
  size_t i;
  array<pybind11::object,_3UL> args;
  size_t size;
  tuple *result;
  handle in_stack_fffffffffffffde8;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *in_stack_fffffffffffffdf0;
  handle in_stack_fffffffffffffdf8;
  array<pybind11::object,_3UL> *in_stack_fffffffffffffe00;
  size_t in_stack_fffffffffffffe08;
  tuple *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *__lhs;
  handle local_168;
  iterator local_160;
  iterator local_158;
  iterator local_150;
  array<pybind11::object,_3UL> *local_148;
  int local_140;
  undefined1 local_13a;
  undefined1 local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [3];
  char *local_90;
  handle local_88;
  PyObject *local_80;
  handle local_78;
  PyObject *local_70;
  handle local_58;
  PyObject *local_50;
  object *local_48;
  array<pybind11::object,_3UL> local_40;
  undefined8 local_28;
  
  local_28 = 3;
  local_48 = local_40._M_elems;
  handle::handle(&local_58,(PyObject *)0x0);
  local_50 = (PyObject *)
             detail::type_caster<int,_void>::cast<int>(0,automatic,in_stack_fffffffffffffde8);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffdf8);
  local_48 = local_40._M_elems + 1;
  handle::handle(&local_78,(PyObject *)0x0);
  local_70 = (PyObject *)
             detail::type_caster<int,_void>::cast<int>(0,automatic,in_stack_fffffffffffffde8);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffdf8);
  local_48 = local_40._M_elems + 2;
  handle::handle(&local_88,(PyObject *)0x0);
  local_80 = (PyObject *)
             detail::type_caster<int,_void>::cast<int>(0,automatic,in_stack_fffffffffffffde8);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffdf8);
  local_90 = (char *)0x0;
  while( true ) {
    __lhs = local_90;
    pcVar3 = (char *)std::array<pybind11::object,_3UL>::size(&local_40);
    if (pcVar3 <= __lhs) {
      local_13a = 0;
      tuple::tuple(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      local_140 = 0;
      local_148 = &local_40;
      local_150 = std::array<pybind11::object,_3UL>::begin((array<pybind11::object,_3UL> *)0x1ad48b)
      ;
      local_158 = std::array<pybind11::object,_3UL>::end((array<pybind11::object,_3UL> *)0x1ad4a0);
      while( true ) {
        if (local_150 == local_158) {
          local_13a = 1;
          std::array<pybind11::object,_3UL>::~array(in_stack_fffffffffffffe00);
          return (tuple)in_RDI.super_handle.m_ptr;
        }
        local_160 = local_150;
        local_168 = object::release(in_stack_fffffffffffffde8.m_ptr);
        ppPVar5 = handle::ptr(&local_168);
        in_stack_fffffffffffffde8.m_ptr = *ppPVar5;
        ppPVar5 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        iVar2 = PyType_HasFeature((*ppPVar5)->ob_type,0x4000000);
        if (iVar2 == 0) break;
        ppPVar5 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        (&(*ppPVar5)[1].ob_type)[local_140] = (PyTypeObject *)in_stack_fffffffffffffde8.m_ptr;
        local_150 = local_150 + 1;
        local_140 = local_140 + 1;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/amlucas[P]sdfTools/src/extern/pybind11/include/pybind11/cast.h"
                    ,0x3d9,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <const int &, const int &, const int &>]"
                   );
    }
    this = &std::array<pybind11::object,_3UL>::operator[]
                      ((array<pybind11::object,_3UL> *)in_stack_fffffffffffffdf0,
                       (size_type)in_stack_fffffffffffffde8.m_ptr)->super_handle;
    bVar1 = handle::operator_cast_to_bool(this);
    if (!bVar1) break;
    local_90 = local_90 + 1;
  }
  __rhs = local_f0;
  local_f8 = __rhs;
  type_id<int_const&>();
  local_f8 = __rhs + 1;
  type_id<int_const&>();
  local_f8 = __rhs + 2;
  type_id<int_const&>();
  local_139 = 1;
  uVar4 = __cxa_allocate_exception(0x10);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
  operator[](in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8.m_ptr);
  std::operator+(__lhs,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdf8.m_ptr,(char *)in_stack_fffffffffffffdf0);
  cast_error::runtime_error
            ((cast_error *)in_stack_fffffffffffffdf0,(string *)in_stack_fffffffffffffde8.m_ptr);
  local_139 = 0;
  __cxa_throw(uVar4,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}